

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

void big2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  byte *pbVar1;
  XML_Size XVar2;
  
  if (1 < (long)end - (long)ptr) {
    XVar2 = pos->columnNumber;
    do {
      if ((byte)*ptr - 0xd8 < 4) goto switchD_003b1fbb_caseD_7;
      if (*ptr == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
        default:
          goto switchD_003b1fbb_caseD_5;
        case 6:
          pbVar1 = (byte *)ptr + 3;
          break;
        case 7:
switchD_003b1fbb_caseD_7:
          pbVar1 = (byte *)ptr + 4;
          break;
        case 9:
          pos->lineNumber = pos->lineNumber + 1;
          pbVar1 = (byte *)ptr + 2;
          XVar2 = 0xffffffffffffffff;
          if (((1 < (long)end - (long)pbVar1) && (*pbVar1 == 0)) &&
             (*(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]) == '\n'))
          goto switchD_003b1fbb_caseD_7;
          break;
        case 10:
          pos->lineNumber = pos->lineNumber + 1;
          XVar2 = 0xffffffffffffffff;
          pbVar1 = (byte *)ptr + 2;
        }
      }
      else {
switchD_003b1fbb_caseD_5:
        pbVar1 = (byte *)ptr + 2;
      }
      ptr = (char *)pbVar1;
      XVar2 = XVar2 + 1;
      pos->columnNumber = XVar2;
    } while (1 < (long)end - (long)ptr);
  }
  return;
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc,
                       const char *ptr,
                       const char *end,
                       POSITION *pos)
{
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = (XML_Size)-1;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = (XML_Size)-1;
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
    pos->columnNumber++;
  }
}